

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integration_test.cc
# Opt level: O3

void __thiscall
prometheus::anon_unknown_0::IntegrationTest_exposeSingleCounter_Test::TestBody
          (IntegrationTest_exposeSingleCounter_Test *this)

{
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  substring;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX;
  undefined8 *puVar1;
  char *pcVar2;
  AssertionResult AVar3;
  shared_ptr<prometheus::Registry> registry;
  string counter_name;
  Response metrics;
  AssertHelper local_108;
  undefined8 *local_100;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_f8;
  undefined8 *local_f0;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> local_e8 [16];
  AssertHelper local_d8 [2];
  undefined1 local_c8 [24];
  _Alloc_hider local_b0;
  undefined1 local_a8 [16];
  char local_98 [16];
  string local_88;
  Response local_68;
  
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"example_total","");
  IntegrationTest::RegisterSomeCounter
            ((IntegrationTest *)(local_c8 + 0x10),(string *)this,&local_88);
  IntegrationTest::FetchMetrics
            (&local_68,&this->super_IntegrationTest,
             &(this->super_IntegrationTest).default_metrics_path_);
  local_d8[0].data_._0_4_ = 200;
  AVar3 = testing::internal::CmpHelperEQ<long,int>
                    ((internal *)&local_f8,"metrics.code","200",&local_68.code,(int *)local_d8);
  puVar1 = local_f0;
  substring._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )AVar3.message_._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
  if (local_f8._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_d8);
    if (local_f0 == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (char *)*local_f0;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/pull/tests/integration/integration_test.cc"
               ,0x6f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    puVar1 = local_f0;
    if (local_d8[0].data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_d8[0].data_ + 8))();
      puVar1 = local_f0;
    }
  }
  else {
    if (local_f0 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_f0 != local_f0 + 2) {
        operator_delete((undefined8 *)*local_f0);
      }
      operator_delete(puVar1);
      substring._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           extraout_RDX._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
    }
    testing::HasSubstr<std::__cxx11::string>
              ((PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_a8,(testing *)&local_88,
               (StringLike<std::__cxx11::basic_string<char>_> *)
               substring._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl);
    local_f8._M_head_impl = local_e8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f8,local_a8._0_8_,(char *)(local_a8._0_8_ + local_a8._8_8_));
    local_d8[0].data_ = (AssertHelperData *)local_c8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_d8,local_f8._M_head_impl,(long)local_f0 + local_f8._M_head_impl);
    if (local_f8._M_head_impl != local_e8) {
      operator_delete(local_f8._M_head_impl);
    }
    testing::internal::
    PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
    ::operator()(&local_108,(char *)local_d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1664e8);
    if (local_d8[0].data_ != (AssertHelperData *)local_c8) {
      operator_delete(local_d8[0].data_);
    }
    if ((char *)local_a8._0_8_ != local_98) {
      operator_delete((void *)local_a8._0_8_);
    }
    puVar1 = local_100;
    if ((char)local_108.data_ == '\0') {
      testing::Message::Message((Message *)&local_f8);
      if (local_100 == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = (char *)*local_100;
      }
      testing::internal::AssertHelper::AssertHelper
                (local_d8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/pull/tests/integration/integration_test.cc"
                 ,0x70,pcVar2);
      testing::internal::AssertHelper::operator=(local_d8,(Message *)&local_f8);
      testing::internal::AssertHelper::~AssertHelper(local_d8);
      puVar1 = local_100;
      if (local_f8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_f8._M_head_impl + 8))();
        puVar1 = local_100;
      }
    }
  }
  if (puVar1 != (undefined8 *)0x0) {
    if ((undefined8 *)*puVar1 != puVar1 + 2) {
      operator_delete((undefined8 *)*puVar1);
    }
    operator_delete(puVar1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.contentType._M_dataplus._M_p != &local_68.contentType.field_2) {
    operator_delete(local_68.contentType._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.body._M_dataplus._M_p != &local_68.body.field_2) {
    operator_delete(local_68.body._M_dataplus._M_p);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._M_p !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  return;
}

Assistant:

TEST_F(IntegrationTest, exposeSingleCounter) {
  const std::string counter_name = "example_total";
  auto registry = RegisterSomeCounter(counter_name, default_metrics_path_);

  const auto metrics = FetchMetrics(default_metrics_path_);

  ASSERT_EQ(metrics.code, 200);
  EXPECT_THAT(metrics.body, HasSubstr(counter_name));
}